

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLTRANSLATEFPROC epoxy_glTranslatef_resolver(void)

{
  PFNGLTRANSLATEFPROC p_Var1;
  
  p_Var1 = (PFNGLTRANSLATEFPROC)
           gl_provider_resolver
                     ("glTranslatef",epoxy_glTranslatef_resolver::providers,
                      epoxy_glTranslatef_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLTRANSLATEFPROC
epoxy_glTranslatef_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_1_0,
        OpenGL_ES_1_0,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        53399 /* "glTranslatef" */,
        53399 /* "glTranslatef" */,
    };
    return gl_provider_resolver(entrypoint_strings + 53399 /* "glTranslatef" */,
                                providers, entrypoints);
}